

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool HasMatchingArgumentNames
               (ArrayView<ArgumentData> *functionArguments,ArrayView<ArgumentData> arguments)

{
  SynIdentifier *pSVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint k;
  ulong uVar7;
  InplaceStr functionArgumentName;
  InplaceStr argumentName;
  
  uVar4 = arguments._8_8_ & 0xffffffff;
  uVar6 = 0;
  do {
    lVar5 = 0x10;
    if (uVar6 == uVar4) {
LAB_001d047d:
      return uVar4 <= uVar6;
    }
    pSVar1 = arguments.data[uVar6].name;
    if (pSVar1 != (SynIdentifier *)0x0) {
      argumentName.begin = (pSVar1->name).begin;
      argumentName.end = (pSVar1->name).end;
      uVar7 = 0;
      do {
        if (functionArguments->count <= uVar7) goto LAB_001d047d;
        lVar2 = *(long *)((long)&functionArguments->data->source + lVar5);
        if (lVar2 != 0) {
          functionArgumentName.begin = *(char **)(lVar2 + 0x40);
          functionArgumentName.end = *(char **)(lVar2 + 0x48);
          bVar3 = InplaceStr::operator==(&functionArgumentName,&argumentName);
          if (bVar3) break;
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x30;
      } while( true );
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool HasMatchingArgumentNames(ArrayView<ArgumentData> &functionArguments, ArrayView<ArgumentData> arguments)
{
	for(unsigned i = 0, e = arguments.count; i < e; i++)
	{
		if(!arguments.data[i].name)
			continue;

		InplaceStr argumentName = arguments.data[i].name->name;

		bool found = false;

		for(unsigned k = 0; k < functionArguments.count; k++)
		{
			if(!functionArguments.data[k].name)
				continue;

			InplaceStr functionArgumentName = functionArguments.data[k].name->name;

			if(functionArgumentName == argumentName)
			{
				found = true;
				break;
			}
		}

		if(!found)
			return false;
	}

	return true;
}